

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O3

int main(int argc,char **argv)

{
  Arguments args;
  sigaction signal_action;
  Arguments local_b0;
  sigaction local_a8;
  
  parse_arguments(&local_b0,argc,argv);
  setup_client_signals(&local_a8);
  communicate(&local_a8,&local_b0);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
	// For command-line arguments
	struct Arguments args;
	struct sigaction signal_action;

	parse_arguments(&args, argc, argv);
	setup_client_signals(&signal_action);

	communicate(&signal_action, &args);
}